

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::fill_M
          (Epnp *this,MatrixXd *M,int row,double *as,double u,double v)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  long in_RCX;
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int i;
  Index in_stack_ffffffffffffff98;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this_00;
  int local_34;
  
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
              (*(double *)(in_RCX + (long)local_34 * 8) * in_RDI[2]);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (this_00,in_stack_ffffffffffffff98,0x9037f6);
    *pSVar3 = (Scalar)this_00;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (this_00,in_stack_ffffffffffffff98,0x90381a);
    *pSVar3 = 0.0;
    dVar1 = *(double *)(in_RCX + (long)local_34 * 8);
    dVar2 = *in_RDI;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (this_00,in_stack_ffffffffffffff98,0x903867);
    *pSVar3 = dVar1 * (dVar2 - in_XMM0_Qa);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (this_00,in_stack_ffffffffffffff98,0x90388d);
    *pSVar3 = 0.0;
    dVar1 = *(double *)(in_RCX + (long)local_34 * 8);
    dVar2 = in_RDI[3];
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (this_00,in_stack_ffffffffffffff98,0x9038d6);
    *pSVar3 = dVar1 * dVar2;
    dVar1 = *(double *)(in_RCX + (long)local_34 * 8);
    dVar2 = in_RDI[1];
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (this_00,in_stack_ffffffffffffff98,0x90392b);
    *pSVar3 = dVar1 * (dVar2 - in_XMM1_Qa);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::fill_M(
    Eigen::MatrixXd & M,
    const int row,
    const double * as,
    const double u,
    const double v)
{
  for(int i = 0; i < 4; i++)
  {
    M(row,3*i) = as[i] * fu;
    M(row,3*i+1) = 0.0;
    M(row,3*i+2) = as[i] * (uc - u);

    M(row+1,3*i) = 0.0;
    M(row+1,3*i+1) = as[i] * fv;
    M(row+1,3*i+2) = as[i] * (vc - v);
  }
}